

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O1

void __thiscall mocker::ir::Reg::~Reg(Reg *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Addr)._vptr_Addr = (_func_int **)&PTR__Reg_001259a0;
  pcVar1 = (this->identifier)._M_dataplus._M_p;
  paVar2 = &(this->identifier).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

explicit Reg(std::string identifier) : identifier(std::move(identifier)) {}